

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestConfigureCommand.cxx
# Opt level: O0

cmCTestGenericHandler * __thiscall
cmCTestConfigureCommand::InitializeHandler(cmCTestConfigureCommand *this)

{
  cmCTest *pcVar1;
  cmMakefile *pcVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  reference ppcVar6;
  char *pcVar7;
  ulong uVar8;
  ostream *poVar9;
  cmake *this_00;
  cmGlobalGenerator *pcVar10;
  string *psVar11;
  reference pbVar12;
  allocator local_4b9;
  string local_4b8;
  cmCTestGenericHandler *local_498;
  cmCTestGenericHandler *handler;
  string local_488;
  allocator local_461;
  string local_460;
  char *local_440;
  char *cmakeGeneratorToolset;
  string local_430;
  char *local_410;
  char *cmakeGeneratorPlatform;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_400;
  undefined8 local_3f8;
  string local_3f0 [8];
  string option;
  const_iterator it;
  string local_3c0 [8];
  string cmakeConfigureCommand;
  string local_398;
  cmGlobalGenerator *local_378;
  cmGlobalGenerator *gg;
  undefined1 local_368 [6];
  bool cmakeBuildTypeInOptions;
  bool multiConfig;
  undefined1 local_348 [8];
  ostringstream e;
  undefined1 local_1d0 [8];
  string cmakelists_file;
  string local_1a8;
  allocator local_181;
  string local_180;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_140;
  string *source_dir;
  string local_130;
  char *local_110;
  char *cmakeGeneratorName;
  string local_100;
  char *local_e0;
  char *ctestConfigureCommand;
  string local_d0;
  allocator local_a9;
  string local_a8;
  string local_88;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  options;
  cmCTestConfigureCommand *this_local;
  
  options.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_30);
  ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      (&(this->super_cmCTestHandlerCommand).Values,6);
  if (*ppcVar6 != (value_type)0x0) {
    ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                        (&(this->super_cmCTestHandlerCommand).Values,6);
    pcVar7 = *ppcVar6;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,pcVar7,&local_51);
    cmSystemTools::ExpandListArgument
              (&local_50,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_30,false);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a8,"BuildDirectory",&local_a9);
  cmCTest::GetCTestConfiguration(&local_88,pcVar1,&local_a8);
  bVar3 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  if ((bVar3 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_d0,
               "Build directory not specified. Either use BUILD argument to CTEST_CONFIGURE command or set CTEST_BINARY_DIRECTORY variable"
               ,(allocator *)((long)&ctestConfigureCommand + 7));
    cmCommand::SetError((cmCommand *)this,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&ctestConfigureCommand + 7));
    this_local = (cmCTestConfigureCommand *)0x0;
    ctestConfigureCommand._0_4_ = 1;
    goto LAB_0057fa11;
  }
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_100,"CTEST_CONFIGURE_COMMAND",
             (allocator *)((long)&cmakeGeneratorName + 7));
  pcVar7 = cmMakefile::GetDefinition(pcVar2,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator((allocator<char> *)((long)&cmakeGeneratorName + 7));
  local_e0 = pcVar7;
  if ((pcVar7 == (char *)0x0) || (*pcVar7 == '\0')) {
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_130,"CTEST_CMAKE_GENERATOR",(allocator *)((long)&source_dir + 7));
    pcVar7 = cmMakefile::GetDefinition(pcVar2,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator((allocator<char> *)((long)&source_dir + 7));
    local_110 = pcVar7;
    if ((pcVar7 == (char *)0x0) || (*pcVar7 == '\0')) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_488,
                 "Configure command is not specified. If this is a \"built with CMake\" project, set CTEST_CMAKE_GENERATOR. If not, set CTEST_CONFIGURE_COMMAND."
                 ,(allocator *)((long)&handler + 7));
      cmCommand::SetError((cmCommand *)this,&local_488);
      std::__cxx11::string::~string((string *)&local_488);
      std::allocator<char>::~allocator((allocator<char> *)((long)&handler + 7));
      this_local = (cmCTestConfigureCommand *)0x0;
      ctestConfigureCommand._0_4_ = 1;
      goto LAB_0057fa11;
    }
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_180,"SourceDirectory",&local_181);
    cmCTest::GetCTestConfiguration(&local_160,pcVar1,&local_180);
    std::__cxx11::string::~string((string *)&local_180);
    std::allocator<char>::~allocator((allocator<char> *)&local_181);
    local_140 = &local_160;
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
                     local_140,"/CMakeLists.txt");
      pcVar7 = (char *)std::__cxx11::string::c_str();
      bVar4 = cmsys::SystemTools::FileExists(pcVar7);
      if (bVar4) {
        gg._7_1_ = 0;
        gg._6_1_ = 0;
        this_00 = cmMakefile::GetCMakeInstance
                            ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.
                             super_cmCommand.Makefile);
        pcVar7 = local_110;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_398,pcVar7,
                   (allocator *)(cmakeConfigureCommand.field_2._M_local_buf + 0xf));
        pcVar10 = cmake::CreateGlobalGenerator(this_00,&local_398);
        std::__cxx11::string::~string((string *)&local_398);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(cmakeConfigureCommand.field_2._M_local_buf + 0xf));
        local_378 = pcVar10;
        if (pcVar10 != (cmGlobalGenerator *)0x0) {
          iVar5 = (*pcVar10->_vptr_cmGlobalGenerator[0x1b])();
          gg._7_1_ = (byte)iVar5 & 1;
          if (local_378 != (cmGlobalGenerator *)0x0) {
            (*local_378->_vptr_cmGlobalGenerator[1])();
          }
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3c0,"\"",(allocator *)((long)&it._M_current + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
        psVar11 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
        std::__cxx11::string::operator+=(local_3c0,(string *)psVar11);
        std::__cxx11::string::operator+=(local_3c0,"\"");
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::__normal_iterator((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)((long)&option.field_2 + 8));
        std::__cxx11::string::string(local_3f0);
        local_400._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_30);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
        ::__normal_iterator<std::__cxx11::string*>
                  ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    *)&local_3f8,&local_400);
        option.field_2._8_8_ = local_3f8;
        while( true ) {
          cmakeGeneratorPlatform =
               (char *)std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_30);
          bVar4 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)((long)&option.field_2 + 8),
                             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&cmakeGeneratorPlatform);
          if (!bVar4) break;
          pbVar12 = __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)((long)&option.field_2 + 8));
          std::__cxx11::string::operator=(local_3f0,(string *)pbVar12);
          std::__cxx11::string::operator+=(local_3c0," \"");
          std::__cxx11::string::operator+=(local_3c0,local_3f0);
          std::__cxx11::string::operator+=(local_3c0,"\"");
          pcVar7 = (char *)std::__cxx11::string::c_str();
          pcVar7 = strstr(pcVar7,"CMAKE_BUILD_TYPE=");
          if (pcVar7 == (char *)0x0) {
            pcVar7 = (char *)std::__cxx11::string::c_str();
            pcVar7 = strstr(pcVar7,"CMAKE_BUILD_TYPE:STRING=");
            if (pcVar7 != (char *)0x0) goto LAB_0057f3ec;
          }
          else {
LAB_0057f3ec:
            gg._6_1_ = 1;
          }
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)((long)&option.field_2 + 8));
        }
        if (((gg._7_1_ & 1) == 0) && ((gg._6_1_ & 1) == 0)) {
          cmCTest::GetConfigType_abi_cxx11_
                    ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
          uVar8 = std::__cxx11::string::empty();
          if ((uVar8 & 1) == 0) {
            std::__cxx11::string::operator+=(local_3c0," \"-DCMAKE_BUILD_TYPE:STRING=");
            psVar11 = cmCTest::GetConfigType_abi_cxx11_
                                ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
            std::__cxx11::string::operator+=(local_3c0,(string *)psVar11);
            std::__cxx11::string::operator+=(local_3c0,"\"");
          }
        }
        std::__cxx11::string::operator+=(local_3c0," \"-G");
        std::__cxx11::string::operator+=(local_3c0,local_110);
        std::__cxx11::string::operator+=(local_3c0,"\"");
        pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_430,"CTEST_CMAKE_GENERATOR_PLATFORM",
                   (allocator *)((long)&cmakeGeneratorToolset + 7));
        pcVar7 = cmMakefile::GetDefinition(pcVar2,&local_430);
        std::__cxx11::string::~string((string *)&local_430);
        std::allocator<char>::~allocator((allocator<char> *)((long)&cmakeGeneratorToolset + 7));
        local_410 = pcVar7;
        if ((pcVar7 != (char *)0x0) && (*pcVar7 != '\0')) {
          std::__cxx11::string::operator+=(local_3c0," \"-A");
          std::__cxx11::string::operator+=(local_3c0,local_410);
          std::__cxx11::string::operator+=(local_3c0,"\"");
        }
        pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_460,"CTEST_CMAKE_GENERATOR_TOOLSET",&local_461);
        pcVar7 = cmMakefile::GetDefinition(pcVar2,&local_460);
        std::__cxx11::string::~string((string *)&local_460);
        std::allocator<char>::~allocator((allocator<char> *)&local_461);
        local_440 = pcVar7;
        if ((pcVar7 != (char *)0x0) && (*pcVar7 != '\0')) {
          std::__cxx11::string::operator+=(local_3c0," \"-T");
          std::__cxx11::string::operator+=(local_3c0,local_440);
          std::__cxx11::string::operator+=(local_3c0,"\"");
        }
        std::__cxx11::string::operator+=(local_3c0," \"");
        std::__cxx11::string::operator+=(local_3c0,(string *)local_140);
        std::__cxx11::string::operator+=(local_3c0,"\"");
        pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
        pcVar7 = (char *)std::__cxx11::string::c_str();
        cmCTest::SetCTestConfiguration
                  (pcVar1,"ConfigureCommand",pcVar7,
                   (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
        std::__cxx11::string::~string(local_3f0);
        std::__cxx11::string::~string(local_3c0);
        ctestConfigureCommand._0_4_ = 0;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_348);
        poVar9 = std::operator<<((ostream *)local_348,"CMakeLists.txt file does not exist [");
        poVar9 = std::operator<<(poVar9,(string *)local_1d0);
        std::operator<<(poVar9,"]");
        std::__cxx11::ostringstream::str();
        cmCommand::SetError((cmCommand *)this,(string *)local_368);
        std::__cxx11::string::~string((string *)local_368);
        this_local = (cmCTestConfigureCommand *)0x0;
        ctestConfigureCommand._0_4_ = 1;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_348);
      }
      std::__cxx11::string::~string((string *)local_1d0);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1a8,
                 "Source directory not specified. Either use SOURCE argument to CTEST_CONFIGURE command or set CTEST_SOURCE_DIRECTORY variable"
                 ,(allocator *)(cmakelists_file.field_2._M_local_buf + 0xf));
      cmCommand::SetError((cmCommand *)this,&local_1a8);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::allocator<char>::~allocator
                ((allocator<char> *)(cmakelists_file.field_2._M_local_buf + 0xf));
      this_local = (cmCTestConfigureCommand *)0x0;
      ctestConfigureCommand._0_4_ = 1;
    }
    std::__cxx11::string::~string((string *)&local_160);
    if ((int)ctestConfigureCommand != 0) goto LAB_0057fa11;
  }
  else {
    cmCTest::SetCTestConfiguration
              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"ConfigureCommand",
               pcVar7,(bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  }
  local_498 = cmCTest::GetInitializedHandler
                        ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"configure")
  ;
  if (local_498 == (cmCTestGenericHandler *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_4b8,"internal CTest error. Cannot instantiate configure handler",
               &local_4b9);
    cmCommand::SetError((cmCommand *)this,&local_4b8);
    std::__cxx11::string::~string((string *)&local_4b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
    this_local = (cmCTestConfigureCommand *)0x0;
    ctestConfigureCommand._0_4_ = 1;
  }
  else {
    cmCTestGenericHandler::SetQuiet(local_498,(bool)((this->super_cmCTestHandlerCommand).Quiet & 1))
    ;
    this_local = (cmCTestConfigureCommand *)local_498;
    ctestConfigureCommand._0_4_ = 1;
  }
LAB_0057fa11:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_30);
  return (cmCTestGenericHandler *)this_local;
}

Assistant:

cmCTestGenericHandler* cmCTestConfigureCommand::InitializeHandler()
{
  std::vector<std::string> options;

  if (this->Values[ctc_OPTIONS])
    {
    cmSystemTools::ExpandListArgument(this->Values[ctc_OPTIONS], options);
    }

  if ( this->CTest->GetCTestConfiguration("BuildDirectory").empty() )
    {
    this->SetError("Build directory not specified. Either use BUILD "
      "argument to CTEST_CONFIGURE command or set CTEST_BINARY_DIRECTORY "
      "variable");
    return 0;
    }

  const char* ctestConfigureCommand
    = this->Makefile->GetDefinition("CTEST_CONFIGURE_COMMAND");

  if ( ctestConfigureCommand && *ctestConfigureCommand )
    {
    this->CTest->SetCTestConfiguration("ConfigureCommand",
      ctestConfigureCommand, this->Quiet);
    }
  else
    {
    const char* cmakeGeneratorName
      = this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR");
    if ( cmakeGeneratorName && *cmakeGeneratorName )
      {
      const std::string& source_dir
        = this->CTest->GetCTestConfiguration("SourceDirectory");
      if ( source_dir.empty() )
        {
        this->SetError("Source directory not specified. Either use SOURCE "
          "argument to CTEST_CONFIGURE command or set CTEST_SOURCE_DIRECTORY "
          "variable");
        return 0;
        }

      const std::string cmakelists_file = source_dir + "/CMakeLists.txt";
      if ( !cmSystemTools::FileExists(cmakelists_file.c_str()) )
        {
        std::ostringstream e;
        e << "CMakeLists.txt file does not exist ["
          << cmakelists_file << "]";
        this->SetError(e.str());
        return 0;
        }

      bool multiConfig = false;
      bool cmakeBuildTypeInOptions = false;

      cmGlobalGenerator *gg =
        this->Makefile->GetCMakeInstance()->CreateGlobalGenerator(
          cmakeGeneratorName);
      if(gg)
        {
        multiConfig = gg->IsMultiConfig();
        delete gg;
        }

      std::string cmakeConfigureCommand = "\"";
      cmakeConfigureCommand += cmSystemTools::GetCMakeCommand();
      cmakeConfigureCommand += "\"";

      std::vector<std::string>::const_iterator it;
      std::string option;
      for (it= options.begin(); it!=options.end(); ++it)
        {
        option = *it;

        cmakeConfigureCommand += " \"";
        cmakeConfigureCommand += option;
        cmakeConfigureCommand += "\"";

        if ((0 != strstr(option.c_str(), "CMAKE_BUILD_TYPE=")) ||
           (0 != strstr(option.c_str(), "CMAKE_BUILD_TYPE:STRING=")))
          {
          cmakeBuildTypeInOptions = true;
          }
        }

      if (!multiConfig && !cmakeBuildTypeInOptions &&
          !this->CTest->GetConfigType().empty())
        {
        cmakeConfigureCommand += " \"-DCMAKE_BUILD_TYPE:STRING=";
        cmakeConfigureCommand += this->CTest->GetConfigType();
        cmakeConfigureCommand += "\"";
        }

      cmakeConfigureCommand += " \"-G";
      cmakeConfigureCommand += cmakeGeneratorName;
      cmakeConfigureCommand += "\"";

      const char* cmakeGeneratorPlatform =
        this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR_PLATFORM");
      if(cmakeGeneratorPlatform && *cmakeGeneratorPlatform)
        {
        cmakeConfigureCommand += " \"-A";
        cmakeConfigureCommand += cmakeGeneratorPlatform;
        cmakeConfigureCommand += "\"";
        }

      const char* cmakeGeneratorToolset =
        this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR_TOOLSET");
      if(cmakeGeneratorToolset && *cmakeGeneratorToolset)
        {
        cmakeConfigureCommand += " \"-T";
        cmakeConfigureCommand += cmakeGeneratorToolset;
        cmakeConfigureCommand += "\"";
        }

      cmakeConfigureCommand += " \"";
      cmakeConfigureCommand += source_dir;
      cmakeConfigureCommand += "\"";

      this->CTest->SetCTestConfiguration("ConfigureCommand",
        cmakeConfigureCommand.c_str(), this->Quiet);
      }
    else
      {
      this->SetError("Configure command is not specified. If this is a "
        "\"built with CMake\" project, set CTEST_CMAKE_GENERATOR. If not, "
        "set CTEST_CONFIGURE_COMMAND.");
      return 0;
      }
    }

  cmCTestGenericHandler* handler
    = this->CTest->GetInitializedHandler("configure");
  if ( !handler )
    {
    this->SetError(
      "internal CTest error. Cannot instantiate configure handler");
    return 0;
    }
  handler->SetQuiet(this->Quiet);
  return handler;
}